

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

int __thiscall Fl_Data_Type::open(Fl_Data_Type *this,char *__file,int __oflag,...)

{
  char cVar1;
  Fl_Input *this_00;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Fl_Class_Type *pFVar5;
  Fl_Text_Buffer *pFVar6;
  Fl_Button *pFVar7;
  char *__s2;
  char *pcVar8;
  char *local_88;
  char *local_78;
  char *n;
  char *q;
  char *p;
  char *s;
  char *c_1;
  char *fn;
  Fl_Widget *w;
  char *message;
  char *c;
  Fl_Data_Type *this_local;
  
  if (data_panel == (Fl_Double_Window *)0x0) {
    make_data_panel();
  }
  this_00 = data_input;
  pcVar4 = Fl_Type::name((Fl_Type *)this);
  Fl_Input_::static_value(&this_00->super_Fl_Input_,pcVar4);
  pFVar5 = Fl_Type::is_in_class((Fl_Type *)this);
  if (pFVar5 == (Fl_Class_Type *)0x0) {
    Fl_Choice::value(data_choice,
                     (int)(this->super_Fl_Decl_Type).public_ & 1U |
                     ((int)(this->super_Fl_Decl_Type).static_ & 1U) << 1);
    (*(data_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
    (*(data_class_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  else {
    Fl_Choice::value(data_class_choice,(int)(this->super_Fl_Decl_Type).public_);
    (*(data_class_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
    (*(data_choice->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  if (this->filename_ == (char *)0x0) {
    local_78 = "";
  }
  else {
    local_78 = this->filename_;
  }
  Fl_Input_::value(&data_filename->super_Fl_Input_,local_78);
  local_88 = Fl_Type::comment((Fl_Type *)this);
  pFVar6 = Fl_Text_Display::buffer(&data_comment_input->super_Fl_Text_Display);
  if (local_88 == (char *)0x0) {
    local_88 = "";
  }
  Fl_Text_Buffer::text(pFVar6,local_88);
  pcVar4 = (char *)data_panel;
  (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  w = (Fl_Widget *)0x0;
  do {
    if (w != (Fl_Widget *)0x0) {
      pcVar4 = "%s";
      fl_alert("%s",w);
    }
    while( true ) {
      pFVar7 = (Fl_Button *)Fl::readqueue();
      if (pFVar7 == data_panel_cancel) goto LAB_00189663;
      if (pFVar7 == &data_panel_ok->super_Fl_Button) break;
      if (pFVar7 == data_filebrowser) {
        goto_source_dir();
        pcVar8 = Fl_Input_::value(&data_filename->super_Fl_Input_);
        pcVar4 = "Load Binary Data";
        pcVar8 = fl_file_chooser("Load Binary Data",(char *)0x0,pcVar8,1);
        leave_source_dir();
        if (pcVar8 != (char *)0x0) {
          pcVar4 = Fl_Input_::value(&data_filename->super_Fl_Input_);
          iVar3 = strcmp(pcVar8,pcVar4);
          if (iVar3 != 0) {
            set_modflag(1);
          }
          pcVar4 = (char *)data_filename;
          Fl_Input_::value(&data_filename->super_Fl_Input_,pcVar8);
        }
      }
      else if (pFVar7 == (Fl_Button *)0x0) {
        Fl::wait(pcVar4);
      }
    }
    pcVar4 = Fl_Input_::value(&data_input->super_Fl_Input_);
    pcVar4 = strdup(pcVar4);
    q = pcVar4;
    while (pcVar8 = q, iVar3 = isspace((uint)(byte)*q), iVar3 != 0) {
      q = q + 1;
    }
    iVar3 = isalpha((uint)(byte)*q);
    if (((iVar3 != 0) || (*q == '_')) || (*q == ':')) {
      do {
        do {
          q = q + 1;
          iVar3 = isalnum((uint)(byte)*q);
        } while (iVar3 != 0);
      } while ((*q == '_') || (*q == ':'));
      for (n = q; *n != '\0'; n = n + 1) {
        iVar3 = isspace((uint)(byte)*n);
        if (iVar3 == 0) goto LAB_0018939f;
      }
      if (pcVar8 != n) break;
    }
LAB_0018939f:
    w = (Fl_Widget *)anon_var_dwarf_1ee0;
    free(pcVar4);
  } while( true );
  *q = '\0';
  Fl_Type::name((Fl_Type *)this,pcVar8);
  free(pcVar4);
  pFVar5 = Fl_Type::is_in_class((Fl_Type *)this);
  if (pFVar5 == (Fl_Class_Type *)0x0) {
    cVar1 = (this->super_Fl_Decl_Type).public_;
    uVar2 = Fl_Choice::value(data_choice);
    if ((int)cVar1 != (uVar2 & 1)) {
      set_modflag(1);
      iVar3 = Fl_Choice::value(data_choice);
      (this->super_Fl_Decl_Type).public_ = (byte)iVar3 & 1;
    }
    cVar1 = (this->super_Fl_Decl_Type).static_;
    iVar3 = Fl_Choice::value(data_choice);
    if ((int)cVar1 != (iVar3 >> 1 & 1U)) {
      set_modflag(1);
      iVar3 = Fl_Choice::value(data_choice);
      (this->super_Fl_Decl_Type).static_ = (byte)(iVar3 >> 1) & 1;
    }
  }
  else {
    cVar1 = (this->super_Fl_Decl_Type).public_;
    iVar3 = Fl_Choice::value(data_class_choice);
    if (cVar1 != iVar3) {
      set_modflag(1);
      iVar3 = Fl_Choice::value(data_class_choice);
      (this->super_Fl_Decl_Type).public_ = (char)iVar3;
    }
  }
  pcVar4 = Fl_Input_::value(&data_filename->super_Fl_Input_);
  if (this->filename_ == (char *)0x0) {
LAB_00189541:
    if ((this->filename_ == (char *)0x0) && (*pcVar4 != '\0')) {
      set_modflag(1);
    }
  }
  else {
    pcVar8 = this->filename_;
    __s2 = Fl_Input_::value(&data_filename->super_Fl_Input_);
    iVar3 = strcmp(pcVar8,__s2);
    if (iVar3 == 0) goto LAB_00189541;
    set_modflag(1);
  }
  if (this->filename_ != (char *)0x0) {
    free(this->filename_);
    this->filename_ = (char *)0x0;
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    pcVar4 = strdup(pcVar4);
    this->filename_ = pcVar4;
  }
  pFVar6 = Fl_Text_Display::buffer(&data_comment_input->super_Fl_Text_Display);
  pcVar4 = Fl_Text_Buffer::text(pFVar6);
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar8 = Fl_Type::comment((Fl_Type *)this);
    if (pcVar8 != (char *)0x0) {
      redraw_browser();
    }
    Fl_Type::comment((Fl_Type *)this,(char *)0x0);
    goto LAB_0018964f;
  }
  pcVar8 = Fl_Type::comment((Fl_Type *)this);
  if (pcVar8 == (char *)0x0) {
LAB_0018961a:
    redraw_browser();
  }
  else {
    pcVar8 = Fl_Type::comment((Fl_Type *)this);
    iVar3 = strcmp(pcVar4,pcVar8);
    if (iVar3 != 0) goto LAB_0018961a;
  }
  Fl_Type::comment((Fl_Type *)this,pcVar4);
LAB_0018964f:
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
  }
LAB_00189663:
  iVar3 = (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar3;
}

Assistant:

void Fl_Data_Type::open() {
  if (!data_panel) make_data_panel();
  data_input->static_value(name());
  if (is_in_class()) {
    data_class_choice->value(public_);
    data_class_choice->show();
    data_choice->hide();
  } else {
    data_choice->value((public_&1)|((static_&1)<<1));
    data_choice->show();
    data_class_choice->hide();
  }
  data_filename->value(filename_?filename_:"");
  const char *c = comment();
  data_comment_input->buffer()->text(c?c:"");
  data_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == data_panel_cancel) goto BREAK2;
      else if (w == data_panel_ok) break;
      else if (w == data_filebrowser) {
        goto_source_dir();
        const char *fn = fl_file_chooser("Load Binary Data", 0L, data_filename->value(), 1);
        leave_source_dir();
        if (fn) {
          if (strcmp(fn, data_filename->value()))
            set_modflag(1); 
          data_filename->value(fn);
        }
      }
      else if (!w) Fl::wait();
    }
    // store the variable name:
    const char*c = data_input->value();
    char *s = strdup(c), *p = s, *q, *n;
    for (;;++p) {
      if (!isspace((unsigned char)(*p))) break;
    }
    n = p;
    if ( (!isalpha((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) goto OOPS;
    ++p;
    for (;;++p) {
      if ( (!isalnum((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) break;
    }
    q = p;
    for (;;++q) {
      if (!*q) break;
      if (!isspace((unsigned char)(*q))) goto OOPS;
    }		
    if (n==q) {
    OOPS: message = "variable name must be a C identifier";
      free((void*)s);
      continue;
    }
    *p = 0;
    name(n);
    free(s);
    // store flags
    if (is_in_class()) {
      if (public_!=data_class_choice->value()) {
        set_modflag(1);
        public_ = data_class_choice->value();
      }
    } else {
      if (public_!=(data_choice->value()&1)) {
        set_modflag(1);
        public_ = (data_choice->value()&1);
      }
      if (static_!=((data_choice->value()>>1)&1)) {
        set_modflag(1);
        static_ = ((data_choice->value()>>1)&1);
      }
    }
    // store the filename
    c = data_filename->value();
    if (filename_ && strcmp(filename_, data_filename->value()))
      set_modflag(1); 
    else if (!filename_ && *c)
      set_modflag(1);
    if (filename_) { free((void*)filename_); filename_ = 0L; }
    if (c && *c) filename_ = strdup(c);
    // store the comment
    c = data_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    break;
  }
BREAK2:
  data_panel->hide();
}